

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  UnitTestSource *pUVar2;
  TestEventListeners *pTVar3;
  DefaultXmlGeneratorListener *pDVar4;
  string *psVar5;
  char *pcVar6;
  Fixed *pFVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_41d0;
  int local_41a0;
  AssertionReturnType<int> local_419c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4198;
  Fixed local_4178;
  ReturnTypedFixed<int> local_3ff0;
  unsigned_long local_3e60;
  undefined1 local_3e58 [8];
  AssertionResult iutest_ar_17;
  int local_3e00;
  AssertionReturnType<int> local_3dfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3df8;
  Fixed local_3dd8;
  ReturnTypedFixed<int> local_3c50;
  unsigned_long local_3ac0;
  undefined1 local_3ab8 [8];
  AssertionResult iutest_ar_16;
  int local_3a60;
  AssertionReturnType<int> local_3a5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a58;
  Fixed local_3a38;
  ReturnTypedFixed<int> local_38b0;
  unsigned_long local_3720;
  undefined1 local_3718 [8];
  AssertionResult iutest_ar_15;
  int local_36c0;
  AssertionReturnType<int> local_36bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_36b8;
  Fixed local_3698;
  ReturnTypedFixed<int> local_3510;
  unsigned_long local_3380;
  undefined1 local_3378 [8];
  AssertionResult iutest_ar_14;
  int local_3320;
  AssertionReturnType<int> local_331c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3318;
  Fixed local_32f8;
  ReturnTypedFixed<int> local_3170;
  unsigned_long local_2fe0;
  undefined1 local_2fd8 [8];
  AssertionResult iutest_ar_13;
  int local_2f80;
  AssertionReturnType<int> local_2f7c;
  Fixed local_2f78;
  ReturnTypedFixed<int> local_2df0;
  undefined1 local_2c60 [8];
  AssertionResult iutest_ar_12;
  undefined1 local_2c30 [4];
  int ret_2;
  OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
  local_2c10;
  AssertionHelper local_2bf0;
  int local_2bc0;
  AssertionReturnType<int> local_2bbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bb8;
  Fixed local_2b98;
  ReturnTypedFixed<int> local_2a10;
  unsigned_long local_2880;
  undefined1 local_2878 [8];
  AssertionResult iutest_ar_11;
  int local_2820;
  AssertionReturnType<int> local_281c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2818;
  Fixed local_27f8;
  ReturnTypedFixed<int> local_2670;
  unsigned_long local_24e0;
  undefined1 local_24d8 [8];
  AssertionResult iutest_ar_10;
  int local_2480;
  AssertionReturnType<int> local_247c;
  Fixed local_2478;
  ReturnTypedFixed<int> local_22f0;
  undefined1 local_2160 [8];
  AssertionResult iutest_ar_9;
  undefined1 local_2130 [4];
  int ret_1;
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
  local_2110;
  AssertionHelper local_20f0;
  int local_20c0;
  AssertionReturnType<int> local_20bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20b8;
  Fixed local_2098;
  ReturnTypedFixed<int> local_1f10;
  unsigned_long local_1d80;
  undefined1 local_1d78 [8];
  AssertionResult iutest_ar_8;
  int local_1d20;
  AssertionReturnType<int> local_1d1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d18;
  Fixed local_1cf8;
  ReturnTypedFixed<int> local_1b70;
  unsigned_long local_19e0;
  undefined1 local_19d8 [8];
  AssertionResult iutest_ar_7;
  int local_1980;
  AssertionReturnType<int> local_197c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1978;
  Fixed local_1958;
  ReturnTypedFixed<int> local_17d0;
  unsigned_long local_1640;
  undefined1 local_1638 [8];
  AssertionResult iutest_ar_6;
  int local_15e0;
  AssertionReturnType<int> local_15dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d8;
  Fixed local_15b8;
  ReturnTypedFixed<int> local_1430;
  unsigned_long local_12a0;
  undefined1 local_1298 [8];
  AssertionResult iutest_ar_5;
  int local_1240;
  AssertionReturnType<int> local_123c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1238;
  Fixed local_1218;
  ReturnTypedFixed<int> local_1090;
  unsigned_long local_f00;
  undefined1 local_ef8 [8];
  AssertionResult iutest_ar_4;
  int local_ea0;
  AssertionReturnType<int> local_e9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98;
  Fixed local_e78;
  ReturnTypedFixed<int> local_cf0;
  unsigned_long local_b60;
  undefined1 local_b58 [8];
  AssertionResult iutest_ar_3;
  int local_b00;
  AssertionReturnType<int> local_afc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  Fixed local_ad8;
  ReturnTypedFixed<int> local_950;
  unsigned_long local_7c0;
  undefined1 local_7b8 [8];
  AssertionResult iutest_ar_2;
  int local_760;
  AssertionReturnType<int> local_75c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  Fixed local_738;
  ReturnTypedFixed<int> local_5b0;
  unsigned_long local_420;
  undefined1 local_418 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_3e8;
  int local_3b8;
  AssertionReturnType<int> local_3b4;
  Fixed local_3b0;
  ReturnTypedFixed<int> local_228;
  undefined1 local_98 [8];
  AssertionResult iutest_ar;
  undefined1 local_68 [4];
  int ret;
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
  local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  iutest::InitIrisUnitTest((int *)&argv_local,argv);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  OptionString(&local_38);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=(&local_38,"junit:test.xml");
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  ~OptionString(&local_38);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
               local_68);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            local_68,"-*Fail*");
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  ~OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
                local_68);
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest_ar._36_4_ = iutest::UnitTestSource::Run(pUVar2);
  if (iutest_ar._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    pTVar3 = iutest::TestEnv::event_listeners();
    pDVar4 = (DefaultXmlGeneratorListener *)
             iutest::TestEventListeners::default_xml_generator(pTVar3);
    psVar5 = iutest::DefaultXmlGeneratorListener::GetFilePath_abi_cxx11_(pDVar4);
    iutest::internal::backward::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((AssertionResult *)local_98,(EqHelper<false> *)"\"test.xml\"",
               "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
               ,"test.xml",(char (*) [9])psVar5,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      memset(&local_3b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3b0);
      local_3b8 = 1;
      local_3b4 = iutest::AssertionReturn<int>(&local_3b8);
      iutest::AssertionHelper::Fixed::operator<<(&local_228,&local_3b0,&local_3b4);
      pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_98);
      iutest::AssertionHelper::AssertionHelper
                (&local_3e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                 ,0x8c,pcVar6,kFatalFailure);
      argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_3e8,&local_228);
      iutest::AssertionHelper::~AssertionHelper(&local_3e8);
      iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_228);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3b0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      local_420 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f591);
      iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
                ((AssertionResult *)local_418,"::std::string::npos","FileIO::s_io.find(\"Fail\")",
                 &std::__cxx11::string::npos,&local_420);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
      if (!bVar1) {
        memset(&local_738,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_738);
        std::__cxx11::string::string((string *)&local_758,(string *)&FileIO::s_io_abi_cxx11_);
        pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_738,&local_758);
        local_760 = 1;
        local_75c = iutest::AssertionReturn<int>(&local_760);
        iutest::AssertionHelper::Fixed::operator<<(&local_5b0,pFVar7,&local_75c);
        pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_418);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_2.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                   ,0x8d,pcVar6,kFatalFailure);
        argv_local._4_4_ =
             iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_5b0)
        ;
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
        iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_5b0);
        std::__cxx11::string::~string((string *)&local_758);
        iutest::AssertionHelper::Fixed::~Fixed(&local_738);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
      if (iutest_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        local_7c0 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f5ba);
        iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                  ((AssertionResult *)local_7b8,"::std::string::npos","FileIO::s_io.find(\"Foo\" )",
                   &std::__cxx11::string::npos,&local_7c0);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
        if (!bVar1) {
          memset(&local_ad8,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_ad8);
          std::__cxx11::string::string((string *)&local_af8,(string *)&FileIO::s_io_abi_cxx11_);
          pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_ad8,&local_af8);
          local_b00 = 1;
          local_afc = iutest::AssertionReturn<int>(&local_b00);
          iutest::AssertionHelper::Fixed::operator<<(&local_950,pFVar7,&local_afc);
          pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_7b8);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_3.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                     ,0x8f,pcVar6,kFatalFailure);
          argv_local._4_4_ =
               iutest::AssertionHelper::operator=
                         ((AssertionHelper *)&iutest_ar_3.m_result,&local_950);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
          iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_950);
          std::__cxx11::string::~string((string *)&local_af8);
          iutest::AssertionHelper::Fixed::~Fixed(&local_ad8);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
        if (iutest_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          local_b60 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f339);
          iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                    ((AssertionResult *)local_b58,"::std::string::npos",
                     "FileIO::s_io.find(\"<skipped type=\\\"iutest.skip\\\"\" )",
                     &std::__cxx11::string::npos,&local_b60);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
          if (!bVar1) {
            memset(&local_e78,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_e78);
            std::__cxx11::string::string((string *)&local_e98,(string *)&FileIO::s_io_abi_cxx11_);
            pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_e78,&local_e98);
            local_ea0 = 1;
            local_e9c = iutest::AssertionReturn<int>(&local_ea0);
            iutest::AssertionHelper::Fixed::operator<<(&local_cf0,pFVar7,&local_e9c);
            pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_b58);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_4.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                       ,0x91,pcVar6,kFatalFailure);
            argv_local._4_4_ =
                 iutest::AssertionHelper::operator=
                           ((AssertionHelper *)&iutest_ar_4.m_result,&local_cf0);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
            iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_cf0);
            std::__cxx11::string::~string((string *)&local_e98);
            iutest::AssertionHelper::Fixed::~Fixed(&local_e78);
          }
          iutest_ar_1._37_3_ = 0;
          iutest_ar_1._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
          if (iutest_ar_1._36_4_ == 0) {
            iutest::detail::AlwaysZero();
            local_f00 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f379);
            iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                      ((AssertionResult *)local_ef8,"::std::string::npos",
                       "FileIO::s_io.find(\"disabled test\" )",&std::__cxx11::string::npos,
                       &local_f00);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
            if (!bVar1) {
              memset(&local_1218,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_1218);
              std::__cxx11::string::string((string *)&local_1238,(string *)&FileIO::s_io_abi_cxx11_)
              ;
              pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_1218,&local_1238);
              local_1240 = 1;
              local_123c = iutest::AssertionReturn<int>(&local_1240);
              iutest::AssertionHelper::Fixed::operator<<(&local_1090,pFVar7,&local_123c);
              pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_ef8);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_5.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                         ,0x93,pcVar6,kFatalFailure);
              argv_local._4_4_ =
                   iutest::AssertionHelper::operator=
                             ((AssertionHelper *)&iutest_ar_5.m_result,&local_1090);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
              iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1090);
              std::__cxx11::string::~string((string *)&local_1238);
              iutest::AssertionHelper::Fixed::~Fixed(&local_1218);
            }
            iutest_ar_1._37_3_ = 0;
            iutest_ar_1._36_1_ = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
            if (iutest_ar_1._36_4_ == 0) {
              iutest::detail::AlwaysZero();
              local_12a0 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f3c4);
              iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                        ((AssertionResult *)local_1298,"::std::string::npos",
                         "FileIO::s_io.find(\"<property name=\\\"fixture\\\" value=\\\"1\\\"\" )",
                         &std::__cxx11::string::npos,&local_12a0);
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1298);
              if (!bVar1) {
                memset(&local_15b8,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_15b8);
                std::__cxx11::string::string
                          ((string *)&local_15d8,(string *)&FileIO::s_io_abi_cxx11_);
                pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_15b8,&local_15d8);
                local_15e0 = 1;
                local_15dc = iutest::AssertionReturn<int>(&local_15e0);
                iutest::AssertionHelper::Fixed::operator<<(&local_1430,pFVar7,&local_15dc);
                pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_1298);
                iutest::AssertionHelper::AssertionHelper
                          ((AssertionHelper *)&iutest_ar_6.m_result,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                           ,0x96,pcVar6,kFatalFailure);
                argv_local._4_4_ =
                     iutest::AssertionHelper::operator=
                               ((AssertionHelper *)&iutest_ar_6.m_result,&local_1430);
                iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
                iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1430);
                std::__cxx11::string::~string((string *)&local_15d8);
                iutest::AssertionHelper::Fixed::~Fixed(&local_15b8);
              }
              iutest_ar_1._37_3_ = 0;
              iutest_ar_1._36_1_ = !bVar1;
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1298);
              if (iutest_ar_1._36_4_ == 0) {
                iutest::detail::AlwaysZero();
                local_1640 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f422);
                iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                          ((AssertionResult *)local_1638,"::std::string::npos",
                           "FileIO::s_io.find(\"<property name=\\\"type_param\\\" value=\" )",
                           &std::__cxx11::string::npos,&local_1640);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1638);
                if (!bVar1) {
                  memset(&local_1958,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_1958);
                  std::__cxx11::string::string
                            ((string *)&local_1978,(string *)&FileIO::s_io_abi_cxx11_);
                  pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_1958,&local_1978);
                  local_1980 = 1;
                  local_197c = iutest::AssertionReturn<int>(&local_1980);
                  iutest::AssertionHelper::Fixed::operator<<(&local_17d0,pFVar7,&local_197c);
                  pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_1638);
                  iutest::AssertionHelper::AssertionHelper
                            ((AssertionHelper *)&iutest_ar_7.m_result,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                             ,0x99,pcVar6,kFatalFailure);
                  argv_local._4_4_ =
                       iutest::AssertionHelper::operator=
                                 ((AssertionHelper *)&iutest_ar_7.m_result,&local_17d0);
                  iutest::AssertionHelper::~AssertionHelper
                            ((AssertionHelper *)&iutest_ar_7.m_result);
                  iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_17d0);
                  std::__cxx11::string::~string((string *)&local_1978);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_1958);
                }
                iutest_ar_1._37_3_ = 0;
                iutest_ar_1._36_1_ = !bVar1;
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1638);
                if (iutest_ar_1._36_4_ == 0) {
                  iutest::detail::AlwaysZero();
                  local_19e0 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x16f481)
                  ;
                  iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                            ((AssertionResult *)local_19d8,"::std::string::npos",
                             "FileIO::s_io.find(\"<property name=\\\"Test/0\\\" value=\\\"0\\\"\" )"
                             ,&std::__cxx11::string::npos,&local_19e0);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_19d8);
                  if (!bVar1) {
                    memset(&local_1cf8,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_1cf8);
                    std::__cxx11::string::string
                              ((string *)&local_1d18,(string *)&FileIO::s_io_abi_cxx11_);
                    pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_1cf8,&local_1d18);
                    local_1d20 = 1;
                    local_1d1c = iutest::AssertionReturn<int>(&local_1d20);
                    iutest::AssertionHelper::Fixed::operator<<(&local_1b70,pFVar7,&local_1d1c);
                    pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_19d8);
                    iutest::AssertionHelper::AssertionHelper
                              ((AssertionHelper *)&iutest_ar_8.m_result,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                               ,0x9d,pcVar6,kFatalFailure);
                    argv_local._4_4_ =
                         iutest::AssertionHelper::operator=
                                   ((AssertionHelper *)&iutest_ar_8.m_result,&local_1b70);
                    iutest::AssertionHelper::~AssertionHelper
                              ((AssertionHelper *)&iutest_ar_8.m_result);
                    iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1b70);
                    std::__cxx11::string::~string((string *)&local_1d18);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_1cf8);
                  }
                  iutest_ar_1._37_3_ = 0;
                  iutest_ar_1._36_1_ = !bVar1;
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_19d8);
                  if (iutest_ar_1._36_4_ == 0) {
                    iutest::detail::AlwaysZero();
                    local_1d80 = std::__cxx11::string::find
                                           ((char *)&FileIO::s_io_abi_cxx11_,0x16f4e0);
                    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                              ((AssertionResult *)local_1d78,"::std::string::npos",
                               "FileIO::s_io.find(\"<property name=\\\"Test/1\\\" value=\\\"10\\\"\" )"
                               ,&std::__cxx11::string::npos,&local_1d80);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1d78);
                    if (!bVar1) {
                      memset(&local_2098,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_2098);
                      std::__cxx11::string::string
                                ((string *)&local_20b8,(string *)&FileIO::s_io_abi_cxx11_);
                      pFVar7 = iutest::AssertionHelper::Fixed::operator<<(&local_2098,&local_20b8);
                      local_20c0 = 1;
                      local_20bc = iutest::AssertionReturn<int>(&local_20c0);
                      iutest::AssertionHelper::Fixed::operator<<(&local_1f10,pFVar7,&local_20bc);
                      pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_1d78);
                      iutest::AssertionHelper::AssertionHelper
                                (&local_20f0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                 ,0x9f,pcVar6,kFatalFailure);
                      argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_20f0,&local_1f10)
                      ;
                      iutest::AssertionHelper::~AssertionHelper(&local_20f0);
                      iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1f10)
                      ;
                      std::__cxx11::string::~string((string *)&local_20b8);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_2098);
                    }
                    iutest_ar_1._37_3_ = 0;
                    iutest_ar_1._36_1_ = !bVar1;
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1d78);
                    if (iutest_ar_1._36_4_ == 0) {
                      std::__cxx11::string::clear();
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                      ::OptionString(&local_2110);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                      ::operator=(&local_2110,"junit");
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                      ::~OptionString(&local_2110);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                      *)local_2130);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                   *)local_2130,"*Fail*");
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::~OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                       *)local_2130);
                      pUVar2 = iutest::UnitTestSource::GetInstance();
                      iutest_ar_9._36_4_ = iutest::UnitTestSource::Run(pUVar2);
                      if (iutest_ar_9._36_4_ == 0) {
                        argv_local._4_4_ = 1;
                      }
                      else {
                        iutest::detail::AlwaysZero();
                        pTVar3 = iutest::TestEnv::event_listeners();
                        pDVar4 = (DefaultXmlGeneratorListener *)
                                 iutest::TestEventListeners::default_xml_generator(pTVar3);
                        psVar5 = iutest::DefaultXmlGeneratorListener::GetFilePath_abi_cxx11_(pDVar4)
                        ;
                        iutest::internal::backward::EqHelper<false>::
                        Compare<char_const*,std::__cxx11::string>
                                  ((AssertionResult *)local_2160,
                                   (EqHelper<false> *)
                                   "::iutest::detail::kStrings::DefaultXmlReportFileName",
                                   "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
                                   ,(char *)&iutest::detail::kStrings::DefaultXmlReportFileName,
                                   (char **)psVar5,in_R9);
                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_2160);
                        if (!bVar1) {
                          memset(&local_2478,0,0x188);
                          iutest::AssertionHelper::Fixed::Fixed(&local_2478);
                          local_2480 = 1;
                          local_247c = iutest::AssertionReturn<int>(&local_2480);
                          iutest::AssertionHelper::Fixed::operator<<
                                    (&local_22f0,&local_2478,&local_247c);
                          pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_2160);
                          iutest::AssertionHelper::AssertionHelper
                                    ((AssertionHelper *)&iutest_ar_10.m_result,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                     ,0xb0,pcVar6,kFatalFailure);
                          argv_local._4_4_ =
                               iutest::AssertionHelper::operator=
                                         ((AssertionHelper *)&iutest_ar_10.m_result,&local_22f0);
                          iutest::AssertionHelper::~AssertionHelper
                                    ((AssertionHelper *)&iutest_ar_10.m_result);
                          iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed
                                    (&local_22f0);
                          iutest::AssertionHelper::Fixed::~Fixed(&local_2478);
                        }
                        iutest_ar_1._37_3_ = 0;
                        iutest_ar_1._36_1_ = !bVar1;
                        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2160);
                        if (iutest_ar_1._36_4_ == 0) {
                          iutest::detail::AlwaysZero();
                          local_24e0 = std::__cxx11::string::find
                                                 ((char *)&FileIO::s_io_abi_cxx11_,0x16f591);
                          iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                                    ((AssertionResult *)local_24d8,"::std::string::npos",
                                     "FileIO::s_io.find(\"Fail\")",&std::__cxx11::string::npos,
                                     &local_24e0);
                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_24d8);
                          if (!bVar1) {
                            memset(&local_27f8,0,0x188);
                            iutest::AssertionHelper::Fixed::Fixed(&local_27f8);
                            std::__cxx11::string::string
                                      ((string *)&local_2818,(string *)&FileIO::s_io_abi_cxx11_);
                            pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                               (&local_27f8,&local_2818);
                            local_2820 = 1;
                            local_281c = iutest::AssertionReturn<int>(&local_2820);
                            iutest::AssertionHelper::Fixed::operator<<
                                      (&local_2670,pFVar7,&local_281c);
                            pcVar6 = iutest::AssertionResult::message((AssertionResult *)local_24d8)
                            ;
                            iutest::AssertionHelper::AssertionHelper
                                      ((AssertionHelper *)&iutest_ar_11.m_result,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                       ,0xb1,pcVar6,kFatalFailure);
                            argv_local._4_4_ =
                                 iutest::AssertionHelper::operator=
                                           ((AssertionHelper *)&iutest_ar_11.m_result,&local_2670);
                            iutest::AssertionHelper::~AssertionHelper
                                      ((AssertionHelper *)&iutest_ar_11.m_result);
                            iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed
                                      (&local_2670);
                            std::__cxx11::string::~string((string *)&local_2818);
                            iutest::AssertionHelper::Fixed::~Fixed(&local_27f8);
                          }
                          iutest_ar_1._37_3_ = 0;
                          iutest_ar_1._36_1_ = !bVar1;
                          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_24d8);
                          if (iutest_ar_1._36_4_ == 0) {
                            iutest::detail::AlwaysZero();
                            local_2880 = std::__cxx11::string::find
                                                   ((char *)&FileIO::s_io_abi_cxx11_,0x16f5ba);
                            iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
                                      ((AssertionResult *)local_2878,"::std::string::npos",
                                       "FileIO::s_io.find(\"Foo\" )",&std::__cxx11::string::npos,
                                       &local_2880);
                            bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_2878);
                            if (!bVar1) {
                              memset(&local_2b98,0,0x188);
                              iutest::AssertionHelper::Fixed::Fixed(&local_2b98);
                              std::__cxx11::string::string
                                        ((string *)&local_2bb8,(string *)&FileIO::s_io_abi_cxx11_);
                              pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                 (&local_2b98,&local_2bb8);
                              local_2bc0 = 1;
                              local_2bbc = iutest::AssertionReturn<int>(&local_2bc0);
                              iutest::AssertionHelper::Fixed::operator<<
                                        (&local_2a10,pFVar7,&local_2bbc);
                              pcVar6 = iutest::AssertionResult::message
                                                 ((AssertionResult *)local_2878);
                              iutest::AssertionHelper::AssertionHelper
                                        (&local_2bf0,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                         ,0xb3,pcVar6,kFatalFailure);
                              argv_local._4_4_ =
                                   iutest::AssertionHelper::operator=(&local_2bf0,&local_2a10);
                              iutest::AssertionHelper::~AssertionHelper(&local_2bf0);
                              iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed
                                        (&local_2a10);
                              std::__cxx11::string::~string((string *)&local_2bb8);
                              iutest::AssertionHelper::Fixed::~Fixed(&local_2b98);
                            }
                            iutest_ar_1._37_3_ = 0;
                            iutest_ar_1._36_1_ = !bVar1;
                            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2878)
                            ;
                            if (iutest_ar_1._36_4_ == 0) {
                              std::__cxx11::string::clear();
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                              ::OptionString(&local_2c10);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                              ::operator=(&local_2c10,"root");
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                              ::~OptionString(&local_2c10);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                              ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                              *)local_2c30);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                              ::operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                           *)local_2c30,(char *)0x0);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                              ::~OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                               *)local_2c30);
                              pUVar2 = iutest::UnitTestSource::GetInstance();
                              iutest_ar_12._36_4_ = iutest::UnitTestSource::Run(pUVar2);
                              if (iutest_ar_12._36_4_ == 0) {
                                argv_local._4_4_ = 1;
                              }
                              else {
                                iutest::detail::AlwaysZero();
                                pTVar3 = iutest::TestEnv::event_listeners();
                                pDVar4 = (DefaultXmlGeneratorListener *)
                                         iutest::TestEventListeners::default_xml_generator(pTVar3);
                                psVar5 = iutest::DefaultXmlGeneratorListener::GetFilePath_abi_cxx11_
                                                   (pDVar4);
                                iutest::internal::backward::EqHelper<false>::
                                Compare<char_const*,std::__cxx11::string>
                                          ((AssertionResult *)local_2c60,
                                           (EqHelper<false> *)
                                           "::iutest::detail::kStrings::DefaultXmlReportFileName",
                                           "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
                                           ,(char *)&iutest::detail::kStrings::
                                                     DefaultXmlReportFileName,(char **)psVar5,in_R9)
                                ;
                                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_2c60);
                                if (!bVar1) {
                                  memset(&local_2f78,0,0x188);
                                  iutest::AssertionHelper::Fixed::Fixed(&local_2f78);
                                  local_2f80 = 1;
                                  local_2f7c = iutest::AssertionReturn<int>(&local_2f80);
                                  iutest::AssertionHelper::Fixed::operator<<
                                            (&local_2df0,&local_2f78,&local_2f7c);
                                  pcVar6 = iutest::AssertionResult::message
                                                     ((AssertionResult *)local_2c60);
                                  iutest::AssertionHelper::AssertionHelper
                                            ((AssertionHelper *)&iutest_ar_13.m_result,
                                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                             ,0xc1,pcVar6,kFatalFailure);
                                  argv_local._4_4_ =
                                       iutest::AssertionHelper::operator=
                                                 ((AssertionHelper *)&iutest_ar_13.m_result,
                                                  &local_2df0);
                                  iutest::AssertionHelper::~AssertionHelper
                                            ((AssertionHelper *)&iutest_ar_13.m_result);
                                  iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed
                                            (&local_2df0);
                                  iutest::AssertionHelper::Fixed::~Fixed(&local_2f78);
                                }
                                iutest_ar_1._37_3_ = 0;
                                iutest_ar_1._36_1_ = !bVar1;
                                iutest::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_2c60);
                                if (iutest_ar_1._36_4_ == 0) {
                                  iutest::detail::AlwaysZero();
                                  local_2fe0 = std::__cxx11::string::find
                                                         ((char *)&FileIO::s_io_abi_cxx11_,0x16f563)
                                  ;
                                  iutest::internal::backward::NeHelper<false>::
                                  Compare<unsigned_long>
                                            ((AssertionResult *)local_2fd8,"::std::string::npos",
                                             "FileIO::s_io.find(\"root.Test\" )",
                                             &std::__cxx11::string::npos,&local_2fe0);
                                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_2fd8);
                                  if (!bVar1) {
                                    memset(&local_32f8,0,0x188);
                                    iutest::AssertionHelper::Fixed::Fixed(&local_32f8);
                                    std::__cxx11::string::string
                                              ((string *)&local_3318,
                                               (string *)&FileIO::s_io_abi_cxx11_);
                                    pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                       (&local_32f8,&local_3318);
                                    local_3320 = 1;
                                    local_331c = iutest::AssertionReturn<int>(&local_3320);
                                    iutest::AssertionHelper::Fixed::operator<<
                                              (&local_3170,pFVar7,&local_331c);
                                    pcVar6 = iutest::AssertionResult::message
                                                       ((AssertionResult *)local_2fd8);
                                    iutest::AssertionHelper::AssertionHelper
                                              ((AssertionHelper *)&iutest_ar_14.m_result,
                                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                               ,0xc2,pcVar6,kFatalFailure);
                                    argv_local._4_4_ =
                                         iutest::AssertionHelper::operator=
                                                   ((AssertionHelper *)&iutest_ar_14.m_result,
                                                    &local_3170);
                                    iutest::AssertionHelper::~AssertionHelper
                                              ((AssertionHelper *)&iutest_ar_14.m_result);
                                    iutest::AssertionHelper::ReturnTypedFixed<int>::
                                    ~ReturnTypedFixed(&local_3170);
                                    std::__cxx11::string::~string((string *)&local_3318);
                                    iutest::AssertionHelper::Fixed::~Fixed(&local_32f8);
                                  }
                                  iutest_ar_1._37_3_ = 0;
                                  iutest_ar_1._36_1_ = !bVar1;
                                  iutest::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_2fd8);
                                  if (iutest_ar_1._36_4_ == 0) {
                                    iutest::detail::AlwaysZero();
                                    local_3380 = std::__cxx11::string::find
                                                           ((char *)&FileIO::s_io_abi_cxx11_,
                                                            0x16f58c);
                                    iutest::internal::backward::NeHelper<false>::
                                    Compare<unsigned_long>
                                              ((AssertionResult *)local_3378,"::std::string::npos",
                                               "FileIO::s_io.find(\"root.Fail\")",
                                               &std::__cxx11::string::npos,&local_3380);
                                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_3378);
                                    if (!bVar1) {
                                      memset(&local_3698,0,0x188);
                                      iutest::AssertionHelper::Fixed::Fixed(&local_3698);
                                      std::__cxx11::string::string
                                                ((string *)&local_36b8,
                                                 (string *)&FileIO::s_io_abi_cxx11_);
                                      pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                         (&local_3698,&local_36b8);
                                      local_36c0 = 1;
                                      local_36bc = iutest::AssertionReturn<int>(&local_36c0);
                                      iutest::AssertionHelper::Fixed::operator<<
                                                (&local_3510,pFVar7,&local_36bc);
                                      pcVar6 = iutest::AssertionResult::message
                                                         ((AssertionResult *)local_3378);
                                      iutest::AssertionHelper::AssertionHelper
                                                ((AssertionHelper *)&iutest_ar_15.m_result,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                 ,0xc4,pcVar6,kFatalFailure);
                                      argv_local._4_4_ =
                                           iutest::AssertionHelper::operator=
                                                     ((AssertionHelper *)&iutest_ar_15.m_result,
                                                      &local_3510);
                                      iutest::AssertionHelper::~AssertionHelper
                                                ((AssertionHelper *)&iutest_ar_15.m_result);
                                      iutest::AssertionHelper::ReturnTypedFixed<int>::
                                      ~ReturnTypedFixed(&local_3510);
                                      std::__cxx11::string::~string((string *)&local_36b8);
                                      iutest::AssertionHelper::Fixed::~Fixed(&local_3698);
                                    }
                                    iutest_ar_1._37_3_ = 0;
                                    iutest_ar_1._36_1_ = !bVar1;
                                    iutest::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_3378);
                                    if (iutest_ar_1._36_4_ == 0) {
                                      iutest::detail::AlwaysZero();
                                      local_3720 = std::__cxx11::string::find
                                                             ((char *)&FileIO::s_io_abi_cxx11_,
                                                              0x16f5b5);
                                      iutest::internal::backward::NeHelper<false>::
                                      Compare<unsigned_long>
                                                ((AssertionResult *)local_3718,"::std::string::npos"
                                                 ,"FileIO::s_io.find(\"root.Foo\" )",
                                                 &std::__cxx11::string::npos,&local_3720);
                                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_3718);
                                      if (!bVar1) {
                                        memset(&local_3a38,0,0x188);
                                        iutest::AssertionHelper::Fixed::Fixed(&local_3a38);
                                        std::__cxx11::string::string
                                                  ((string *)&local_3a58,
                                                   (string *)&FileIO::s_io_abi_cxx11_);
                                        pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                           (&local_3a38,&local_3a58);
                                        local_3a60 = 1;
                                        local_3a5c = iutest::AssertionReturn<int>(&local_3a60);
                                        iutest::AssertionHelper::Fixed::operator<<
                                                  (&local_38b0,pFVar7,&local_3a5c);
                                        pcVar6 = iutest::AssertionResult::message
                                                           ((AssertionResult *)local_3718);
                                        iutest::AssertionHelper::AssertionHelper
                                                  ((AssertionHelper *)&iutest_ar_16.m_result,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,0xc6,pcVar6,kFatalFailure);
                                        argv_local._4_4_ =
                                             iutest::AssertionHelper::operator=
                                                       ((AssertionHelper *)&iutest_ar_16.m_result,
                                                        &local_38b0);
                                        iutest::AssertionHelper::~AssertionHelper
                                                  ((AssertionHelper *)&iutest_ar_16.m_result);
                                        iutest::AssertionHelper::ReturnTypedFixed<int>::
                                        ~ReturnTypedFixed(&local_38b0);
                                        std::__cxx11::string::~string((string *)&local_3a58);
                                        iutest::AssertionHelper::Fixed::~Fixed(&local_3a38);
                                      }
                                      iutest_ar_1._37_3_ = 0;
                                      iutest_ar_1._36_1_ = !bVar1;
                                      iutest::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_3718);
                                      if (iutest_ar_1._36_4_ == 0) {
                                        iutest::detail::AlwaysZero();
                                        local_3ac0 = std::__cxx11::string::find
                                                               ((char *)&FileIO::s_io_abi_cxx11_,
                                                                0x16f5dd);
                                        iutest::internal::backward::EqHelper<false>::
                                        Compare<unsigned_long>
                                                  ((AssertionResult *)local_3ab8,
                                                   "::std::string::npos",
                                                   "FileIO::s_io.find(\"root.Bar\" )",
                                                   &std::__cxx11::string::npos,&local_3ac0);
                                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_3ab8);
                                        if (!bVar1) {
                                          memset(&local_3dd8,0,0x188);
                                          iutest::AssertionHelper::Fixed::Fixed(&local_3dd8);
                                          std::__cxx11::string::string
                                                    ((string *)&local_3df8,
                                                     (string *)&FileIO::s_io_abi_cxx11_);
                                          pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                             (&local_3dd8,&local_3df8);
                                          local_3e00 = 1;
                                          local_3dfc = iutest::AssertionReturn<int>(&local_3e00);
                                          iutest::AssertionHelper::Fixed::operator<<
                                                    (&local_3c50,pFVar7,&local_3dfc);
                                          pcVar6 = iutest::AssertionResult::message
                                                             ((AssertionResult *)local_3ab8);
                                          iutest::AssertionHelper::AssertionHelper
                                                    ((AssertionHelper *)&iutest_ar_17.m_result,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,200,pcVar6,kFatalFailure);
                                          argv_local._4_4_ =
                                               iutest::AssertionHelper::operator=
                                                         ((AssertionHelper *)&iutest_ar_17.m_result,
                                                          &local_3c50);
                                          iutest::AssertionHelper::~AssertionHelper
                                                    ((AssertionHelper *)&iutest_ar_17.m_result);
                                          iutest::AssertionHelper::ReturnTypedFixed<int>::
                                          ~ReturnTypedFixed(&local_3c50);
                                          std::__cxx11::string::~string((string *)&local_3df8);
                                          iutest::AssertionHelper::Fixed::~Fixed(&local_3dd8);
                                        }
                                        iutest_ar_1._37_3_ = 0;
                                        iutest_ar_1._36_1_ = !bVar1;
                                        iutest::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_3ab8);
                                        if (iutest_ar_1._36_4_ == 0) {
                                          iutest::detail::AlwaysZero();
                                          local_3e60 = std::__cxx11::string::find
                                                                 ((char *)&FileIO::s_io_abi_cxx11_,
                                                                  0x16f605);
                                          iutest::internal::backward::NeHelper<false>::
                                          Compare<unsigned_long>
                                                    ((AssertionResult *)local_3e58,
                                                     "::std::string::npos",
                                                     "FileIO::s_io.find(\"test.Foo\" )",
                                                     &std::__cxx11::string::npos,&local_3e60);
                                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_3e58);
                                          if (!bVar1) {
                                            memset(&local_4178,0,0x188);
                                            iutest::AssertionHelper::Fixed::Fixed(&local_4178);
                                            std::__cxx11::string::string
                                                      ((string *)&local_4198,
                                                       (string *)&FileIO::s_io_abi_cxx11_);
                                            pFVar7 = iutest::AssertionHelper::Fixed::operator<<
                                                               (&local_4178,&local_4198);
                                            local_41a0 = 1;
                                            local_419c = iutest::AssertionReturn<int>(&local_41a0);
                                            iutest::AssertionHelper::Fixed::operator<<
                                                      (&local_3ff0,pFVar7,&local_419c);
                                            pcVar6 = iutest::AssertionResult::message
                                                               ((AssertionResult *)local_3e58);
                                            iutest::AssertionHelper::AssertionHelper
                                                      (&local_41d0,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,0xcb,pcVar6,kFatalFailure);
                                            argv_local._4_4_ =
                                                 iutest::AssertionHelper::operator=
                                                           (&local_41d0,&local_3ff0);
                                            iutest::AssertionHelper::~AssertionHelper(&local_41d0);
                                            iutest::AssertionHelper::ReturnTypedFixed<int>::
                                            ~ReturnTypedFixed(&local_3ff0);
                                            std::__cxx11::string::~string((string *)&local_4198);
                                            iutest::AssertionHelper::Fixed::~Fixed(&local_4178);
                                          }
                                          iutest_ar_1._37_3_ = 0;
                                          iutest_ar_1._36_1_ = !bVar1;
                                          iutest::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_3e58);
                                          if (iutest_ar_1._36_4_ == 0) {
                                            std::__cxx11::string::clear();
                                            printf("*** Successful ***\n");
                                            argv_local._4_4_ = 0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_JUNIT_XML_TEST
    IUTEST_INIT(&argc, argv);

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";

    {
        ::iutest::IUTEST_FLAG(filter) = "-*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;

        IUTEST_ASSERT_EQ( "test.xml"
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<skipped type=\"iutest.skip\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("disabled test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"fixture\" value=\"1\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_TYPED_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"type_param\" value=" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#if IUTEST_HAS_PARAM_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/0\" value=\"0\""  ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/1\" value=\"10\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#endif

        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit";
    {
        ::iutest::IUTEST_FLAG(filter) = "*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);

        FileIO::s_io.clear();
    }
    {
        ::iutest::IUTEST_FLAG(default_package_name) = "root";
        ::iutest::IUTEST_FLAG(filter) = NULL;
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("root.Bar" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_PACKAGE
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("test.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif

        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_JUNIT_XML_TEST=0 ***\n");
#endif
    return 0;
}